

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_1785d::IDLTypeIdentifierVisitor::visit_
          (IDLTypeIdentifierVisitor *this,NullType *type)

{
  Type *type_;
  UnsupportedType *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  Type *local_18;
  NullType *type_local;
  IDLTypeIdentifierVisitor *this_local;
  
  local_18 = (Type *)type;
  type_local = (NullType *)this;
  this_00 = (UnsupportedType *)__cxa_allocate_exception(0x38);
  type_ = local_18;
  Typelib::Type::getName_abi_cxx11_();
  std::operator+(&local_38,"null types are not supported for export in IDL, found ",&local_58);
  Typelib::UnsupportedType::UnsupportedType(this_00,type_,&local_38);
  __cxa_throw(this_00,&Typelib::UnsupportedType::typeinfo,Typelib::UnsupportedType::~UnsupportedType
             );
}

Assistant:

bool IDLTypeIdentifierVisitor::visit_(NullType const& type)
    { throw UnsupportedType(type, "null types are not supported for export in IDL, found " + type.getName()); }